

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

skiwi_compiled_function_ptr skiwi::skiwi_compile(string *scheme_expression)

{
  fptr local_20;
  fptr f;
  uint64_t size;
  string *scheme_expression_local;
  
  size = (uint64_t)scheme_expression;
  local_20 = anon_unknown_1::compile
                       ((uint64_t *)&f,scheme_expression,
                        (environment_map *)((anonymous_namespace)::cd + 0x220),
                        (repl_data *)((anonymous_namespace)::cd + 0x188));
  if (local_20 != (fptr)0x0) {
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)((anonymous_namespace)::cd + 0x230),
               (_func_unsigned_long_void_ptr_varargs **)&local_20,(unsigned_long *)&f);
  }
  return local_20;
}

Assistant:

skiwi_compiled_function_ptr skiwi_compile(const std::string& scheme_expression)
  {
  using namespace SKIWI;
  uint64_t size;
  auto f = compile(size, scheme_expression, cd.env, cd.rd);
  if (f)
    {
#ifdef _SKIWI_FOR_ARM
    cd.compiled_bytecode.emplace_back(f, size);
#else
    cd.compiled_functions.emplace_back(f, size);
#endif
    }
  return (skiwi_compiled_function_ptr)f;
  }